

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_subscription_list(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_181;
  int ret;
  HttpTestListener *local_160;
  HttpTestListener *listener;
  string local_150;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [55];
  allocator<char> local_c9;
  string local_c8 [32];
  Ons *local_a8;
  Ons *ons;
  OnsOnsSubscriptionListResponseType resp;
  OnsOnsSubscriptionListRequestType req;
  
  aliyun::OnsOnsSubscriptionListRequestType::OnsOnsSubscriptionListRequestType
            ((OnsOnsSubscriptionListRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsSubscriptionListResponseType::OnsOnsSubscriptionListResponseType
            ((OnsOnsSubscriptionListResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"cn-hangzhou",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"my_appid",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_secret",&local_129);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_c8,local_100,local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a8 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsSubscriptionListResponseType::~OnsOnsSubscriptionListResponseType
              ((OnsOnsSubscriptionListResponseType *)&ons);
    aliyun::OnsOnsSubscriptionListRequestType::~OnsOnsSubscriptionListRequestType
              ((OnsOnsSubscriptionListRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_a8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_subscription_list_response;
  local_160 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_181);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_181);
  HttpTestListener::Start(local_160);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  aliyun::Ons::OnsSubscriptionList
            (local_a8,(OnsOnsSubscriptionListRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsSubscriptionListResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_160);
  pHVar3 = local_160;
  if (local_160 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_160);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_a8;
  if (local_a8 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_a8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_subscription_list() {
  OnsOnsSubscriptionListRequestType req;
  OnsOnsSubscriptionListResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_subscription_list_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  int ret = ons->OnsSubscriptionList(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}